

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerate.cpp
# Opt level: O2

void __thiscall
luna::CodeGenerateVisitor::Visit
          (CodeGenerateVisitor *this,LocalNameListStatement *l_namelist_stmt,void *data)

{
  uint uVar1;
  SyntaxTree *pSVar2;
  size_t sVar3;
  ExpListData_conflict exp_list_data;
  NameListData_conflict name_list_data;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  if ((l_namelist_stmt->exp_list_)._M_t.
      super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
      super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
      super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl == (SyntaxTree *)0x0) {
    name_list_data.need_init_ = true;
  }
  else {
    uVar1 = this->current_function_->register_id_;
    sVar3 = l_namelist_stmt->name_count_;
    local_48._12_4_ = 0;
    local_48._8_4_ = uVar1;
    local_30 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:1136:21)>
               ::_M_invoke;
    local_38 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp:1136:21)>
               ::_M_manager;
    exp_list_data = (ExpListData_conflict)this;
    local_48._M_unused._M_object = this;
    Guard::Guard((Guard *)&name_list_data,(function<void_()> *)&exp_list_data,
                 (function<void_()> *)&local_48);
    std::_Function_base::~_Function_base((_Function_base *)&local_48);
    std::_Function_base::~_Function_base((_Function_base *)&exp_list_data);
    exp_list_data.end_register_ = (int)sVar3 + uVar1;
    exp_list_data.start_register_ = uVar1;
    pSVar2 = (l_namelist_stmt->exp_list_)._M_t.
             super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
             super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
             super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
    (*pSVar2->_vptr_SyntaxTree[2])(pSVar2,this,&exp_list_data);
    Guard::~Guard((Guard *)&name_list_data);
    name_list_data.need_init_ =
         (l_namelist_stmt->exp_list_)._M_t.
         super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
         super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
         super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl == (SyntaxTree *)0x0;
  }
  pSVar2 = (l_namelist_stmt->name_list_)._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  (*pSVar2->_vptr_SyntaxTree[2])(pSVar2,this);
  return;
}

Assistant:

void CodeGenerateVisitor::Visit(LocalNameListStatement *l_namelist_stmt, void *data)
    {
        // Generate code for expression list first, then expression list can get
        // variables which has the same name with variables defined in NameList
        // e.g.
        //     local i = 1
        //     local i = i -- i value is 1
        if (l_namelist_stmt->exp_list_)
        {
            // Reserve registers for NameList
            int start_register = GetNextRegisterId();
            int end_register = start_register + l_namelist_stmt->name_count_;
            Guard g([=]() { this->ResetRegisterIdGenerator(end_register); },
                    [=]() { this->ResetRegisterIdGenerator(start_register); });

            try
            {
                ExpListData exp_list_data{ start_register, end_register };
                l_namelist_stmt->exp_list_->Accept(this, &exp_list_data);
            }
            catch (const CodeGenerateException &)
            {
                throw CodeGenerateException(
                    GetCurrentFunction()->GetModule()->GetCStr(),
                    l_namelist_stmt->line_,
                    "expression of local name list is too complex");
            }
        }

        // NameList need init itself when ExpList is not existed
        NameListData name_list_data{ !l_namelist_stmt->exp_list_ };
        l_namelist_stmt->name_list_->Accept(this, &name_list_data);
    }